

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * pstore::path::posix::join
                   (string *__return_storage_ptr__,string *a,
                   initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *p)

{
  pointer pcVar1;
  char *pcVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  iterator pbVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (a->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + a->_M_string_length);
  if (p->_M_len != 0) {
    pbVar4 = p->_M_array;
    lVar3 = p->_M_len << 5;
    do {
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      if ((pbVar4->_M_string_length == 0) || (*pcVar2 != '/')) {
        if ((__return_storage_ptr__->_M_string_length != 0) &&
           ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
            != '/')) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          pcVar2 = (pbVar4->_M_dataplus)._M_p;
        }
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)pcVar2);
      }
      else {
        std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      }
      pbVar4 = pbVar4 + 1;
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join (std::string const & a, std::initializer_list<std::string> const & p) {
                std::string path = a;
                for (auto const & b : p) {
                    if (starts_with (b, '/')) {
                        path = b;
                    } else if (path.empty () || ends_with (path, '/')) {
                        path += b;
                    } else {
                        path += '/';
                        path += b;
                    }
                }
                return path;
            }